

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void set_unmapped_ref(RefBufMapData *buffer_map,int n_bufs,int n_min_level_refs,int min_level,
                     int cur_frame_disp)

{
  int iVar1;
  int dist;
  int i;
  int unmapped_idx;
  int max_dist;
  int cur_frame_disp_local;
  int min_level_local;
  int n_min_level_refs_local;
  int n_bufs_local;
  RefBufMapData *buffer_map_local;
  
  max_dist = 0;
  unmapped_idx = -1;
  if (7 < n_bufs) {
    for (i = 0; i < n_bufs; i = i + 1) {
      if ((buffer_map[i].used == 0) &&
         ((buffer_map[i].pyr_level != min_level || (4 < n_min_level_refs)))) {
        iVar1 = cur_frame_disp - buffer_map[i].disp_order;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (max_dist < iVar1) {
          unmapped_idx = i;
          max_dist = iVar1;
        }
      }
    }
    buffer_map[unmapped_idx].used = 1;
  }
  return;
}

Assistant:

static void set_unmapped_ref(RefBufMapData *buffer_map, int n_bufs,
                             int n_min_level_refs, int min_level,
                             int cur_frame_disp) {
  int max_dist = 0;
  int unmapped_idx = -1;
  if (n_bufs <= ALTREF_FRAME) return;
  for (int i = 0; i < n_bufs; i++) {
    if (buffer_map[i].used) continue;
    if (buffer_map[i].pyr_level != min_level ||
        n_min_level_refs >= LOW_LEVEL_FRAMES_TR) {
      int dist = abs(cur_frame_disp - buffer_map[i].disp_order);
      if (dist > max_dist) {
        max_dist = dist;
        unmapped_idx = i;
      }
    }
  }
  assert(unmapped_idx >= 0 && "Unmapped reference not found");
  buffer_map[unmapped_idx].used = 1;
}